

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPattern.cpp
# Opt level: O1

void __thiscall
TPZRefPattern::CreateMidSideNodes
          (TPZRefPattern *this,TPZGeoEl *gel,int side,TPZVec<long> *newnodeindexes)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  TPZGeoMesh *pTVar1;
  int iVar2;
  TPZGeoNode *pTVar3;
  TPZGeoEl *pTVar4;
  ostream *poVar5;
  int k;
  long lVar6;
  long nelem;
  int k_1;
  long lVar7;
  double dVar8;
  double dVar9;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> refnodecoord_X;
  TPZManVector<double,_3> neighbourcoord_X;
  TPZManVector<double,_3> newnodecoord_X;
  TPZManVector<double,_3> newnodecoord_xi;
  TPZManVector<int,_10> sideNodes;
  TPZManVector<long,_10> sideindices;
  TPZGeoElSide local_208;
  TPZRefPattern *local_1f0;
  TPZGeoMesh *local_1e8;
  TPZGeoEl *local_1e0;
  long local_1d8;
  double local_1d0;
  TPZManVector<double,_3> local_1c8;
  TPZManVector<double,_3> local_190;
  TPZManVector<double,_3> local_158;
  TPZManVector<double,_3> local_120;
  TPZManVector<int,_10> local_e8;
  TPZManVector<long,_10> local_a0;
  
  local_1e8 = gel->fMesh;
  TPZManVector<int,_10>::TPZManVector(&local_e8,0);
  local_1f0 = this;
  TPZVec<int>::operator=
            (&local_e8.super_TPZVec<int>,&(this->fFatherSideInfo).fStore[side].fSideNodes);
  if (gel == (TPZGeoEl *)0x0) {
    local_208.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_208.fGeoEl = (TPZGeoEl *)0x0;
    local_208.fSide = -1;
  }
  else {
    (**(code **)(*(long *)gel + 0x188))(&local_208,gel,side);
  }
  local_1e0 = gel;
  TPZManVector<long,_10>::TPZManVector(&local_a0,0);
  if (local_208.fGeoEl != (TPZGeoEl *)0x0) {
    do {
      if ((local_208.fGeoEl == local_1e0) && (local_208.fSide == side)) break;
      iVar2 = TPZGeoElSide::HasSubElement(&local_208);
      if ((iVar2 != 0) &&
         (iVar2 = (**(code **)(*(long *)local_208.fGeoEl + 0x150))(local_208.fGeoEl,local_208.fSide)
         , 1 < iVar2)) {
        (**(code **)(*(long *)local_208.fGeoEl + 0x120))(local_208.fGeoEl,local_208.fSide,&local_a0)
        ;
        break;
      }
      if (local_208.fGeoEl == (TPZGeoEl *)0x0) {
        local_1c8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_01920090;
        local_1c8.super_TPZVec<double>.fStore = (double *)0x0;
        local_1c8.super_TPZVec<double>.fNElements._0_4_ = -1;
      }
      else {
        (**(code **)(*(long *)local_208.fGeoEl + 0x188))
                  (&local_1c8,local_208.fGeoEl,local_208.fSide);
      }
      local_208.fSide = (int)local_1c8.super_TPZVec<double>.fNElements;
      local_208.fGeoEl = (TPZGeoEl *)local_1c8.super_TPZVec<double>.fStore;
    } while ((TPZGeoEl *)local_1c8.super_TPZVec<double>.fStore != (TPZGeoEl *)0x0);
  }
  if (0 < local_e8.super_TPZVec<int>.fNElements) {
    pTVar1 = &local_1f0->fRefPatternMesh;
    this_00 = &local_1e8->fNodeVec;
    lVar6 = 0;
    do {
      nelem = (long)local_e8.super_TPZVec<int>.fStore[lVar6];
      local_190.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      local_1d8 = lVar6;
      TPZManVector<double,_3>::TPZManVector(&local_1c8,3,(double *)&local_190);
      local_120.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&local_190,3,(double *)&local_120);
      lVar6 = 0;
      do {
        pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&(pTVar1->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,nelem);
        ((long *)local_1c8.super_TPZVec<double>.fStore)[lVar6] = (long)pTVar3->fCoord[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      pTVar4 = Element(local_1f0,0);
      iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
      local_158.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&local_120,(long)iVar2,(double *)&local_158);
      lVar6 = 0;
      while( true ) {
        pTVar4 = Element(local_1f0,0);
        iVar2 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        if (iVar2 <= lVar6) break;
        local_120.super_TPZVec<double>.fStore[lVar6] =
             (double)((long *)local_1c8.super_TPZVec<double>.fStore)[lVar6];
        lVar6 = lVar6 + 1;
      }
      TPZManVector<double,_3>::TPZManVector(&local_158,3);
      (**(code **)(*(long *)local_1e0 + 0x228))(local_1e0,&local_120,&local_158);
      newnodeindexes->fStore[nelem] = -1;
      if (local_a0.super_TPZVec<long>.fNElements < 1) {
        lVar6 = -1;
        dVar8 = -1.0;
      }
      else {
        iVar2 = -1;
        lVar6 = 0;
        dVar8 = -1.0;
        do {
          lVar7 = 0;
          local_1d0 = dVar8;
          do {
            pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,
                                local_a0.super_TPZVec<long>.fStore[lVar6]);
            local_190.super_TPZVec<double>.fStore[lVar7] = pTVar3->fCoord[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar9 = 0.0;
          lVar7 = 0;
          do {
            dVar9 = dVar9 + (local_158.super_TPZVec<double>.fStore[lVar7] -
                            local_190.super_TPZVec<double>.fStore[lVar7]) *
                            (local_158.super_TPZVec<double>.fStore[lVar7] -
                            local_190.super_TPZVec<double>.fStore[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar8 = dVar9;
          if (local_1d0 <= dVar9 && -1 < iVar2) {
            dVar8 = local_1d0;
          }
          if (local_1d0 > dVar9 || -1 >= iVar2) {
            iVar2 = (int)lVar6;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_a0.super_TPZVec<long>.fNElements);
        lVar6 = (long)iVar2;
      }
      if (local_a0.super_TPZVec<long>.fNElements != 0 && dVar8 < 0.01) {
        newnodeindexes->fStore[nelem] = local_a0.super_TPZVec<long>.fStore[lVar6];
      }
      if ((0.01 <= dVar8) && (local_a0.super_TPZVec<long>.fNElements != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Refpattern is trying to create midnode but there is another node which is not in the right position!\n"
                   ,0x65);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Either the refinement patterns are incompatible or there is an issue with the mapping.\n"
                   ,0x57);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"newnodecoord_X(",0xf);
        poVar5 = std::ostream::_M_insert<double>(*local_158.super_TPZVec<double>.fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<double>(local_158.super_TPZVec<double>.fStore[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<double>(local_158.super_TPZVec<double>.fStore[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"neighbourcoord_X(",0x11);
        poVar5 = std::ostream::_M_insert<double>(*local_190.super_TPZVec<double>.fStore);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<double>(local_190.super_TPZVec<double>.fStore[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<double>(local_190.super_TPZVec<double>.fStore[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPattern.cpp"
                   ,0x29b);
      }
      if (newnodeindexes->fStore[nelem] == -1) {
        iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
        pTVar3 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar2);
        TPZGeoNode::Initialize(pTVar3,&local_158.super_TPZVec<double>,local_1e8);
        newnodeindexes->fStore[nelem] = (long)iVar2;
      }
      TPZManVector<double,_3>::~TPZManVector(&local_158);
      TPZManVector<double,_3>::~TPZManVector(&local_120);
      TPZManVector<double,_3>::~TPZManVector(&local_190);
      TPZManVector<double,_3>::~TPZManVector(&local_1c8);
      lVar6 = local_1d8 + 1;
    } while (lVar6 < local_e8.super_TPZVec<int>.fNElements);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  TPZManVector<int,_10>::~TPZManVector(&local_e8);
  return;
}

Assistant:

void TPZRefPattern::CreateMidSideNodes(TPZGeoEl * gel, int side, TPZVec<int64_t> &newnodeindexes)
{
	TPZGeoMesh *gmesh = gel->Mesh();
	//SideNodes returns a vector with the indexes of the internal nodes of the side side
	TPZManVector<int> sideNodes;
	SideNodes(side,sideNodes);
	TPZGeoElSide gelside(gel,side);
	TPZGeoElSide neighbour(gelside.Neighbour());
	TPZManVector<int64_t> sideindices(0);
	//checks if a neighbour element has created a midsidenode already
	while(neighbour.Element() && neighbour != gelside){
		if(neighbour.HasSubElement() && neighbour.Element()->NSideSubElements(neighbour.Side()) > 1)
		{
			neighbour.Element()->MidSideNodeIndices(neighbour.Side(),sideindices);
			break;
		}
		neighbour = neighbour.Neighbour();
	}
	for (int j=0;j<sideNodes.NElements();j++){
		int index = sideNodes[j];
		//new node coordinates
		TPZManVector<REAL,3> refnodecoord_X(3,0.);
		TPZManVector<REAL,3> neighbourcoord_X(3,0.);

		for (int k=0;k<3;k++){
            double coord = fRefPatternMesh.NodeVec()[index].Coord(k);
            refnodecoord_X[k] = coord;
        }

		TPZManVector<REAL,3> newnodecoord_xi(Element(0)->Dimension(),0.);

		//getting node coordinates in refpattern mesh: just a matter of adjusting dimension
		for(int iX = 0; iX < Element(0)->Dimension(); iX++) newnodecoord_xi[iX] = refnodecoord_X[iX];

        //coordinates of the node to be created (if it hasnt been created yet)
		TPZManVector<REAL,3> newnodecoord_X(3);
		gel->X(newnodecoord_xi,newnodecoord_X);

		newnodeindexes[index] = -1;
		REAL smallestDiff = -1.;
		int smallestDiffIndex = -1;
		//check if the node has already been created using information previsouly obtained from neighbour
		for(int i=0; i< sideindices.NElements(); i++)
		{
			for(int k=0; k<3; k++) neighbourcoord_X[k] = gmesh->NodeVec()[sideindices[i]].Coord(k);
			REAL dif = 0.;
			for (int k=0;k<3;k++)
			{
				dif += (newnodecoord_X[k] - neighbourcoord_X[k]) * (newnodecoord_X[k] - neighbourcoord_X[k]);
			}
			if(smallestDiffIndex < 0. || smallestDiff > dif)
			{
				smallestDiff = dif;
				smallestDiffIndex = i;
			}
		}
		if (smallestDiff < 1e-2 && sideindices.NElements() != 0)
		{
			newnodeindexes[index] = sideindices[smallestDiffIndex];
		}
		if (smallestDiff >= 1.e-2 && sideindices.NElements() != 0)
		{
#ifdef PZ_LOG
			{
				std::stringstream sout;
				sout << "Incompatible refinement patterns detected\n";
				sout << "Closest node at distance " << smallestDiff << std::endl;
				gel->Print(sout);
				LOGPZ_ERROR(logger,sout.str())
			}
#endif
            std::cout << "Refpattern is trying to create midnode but there is another node which is not in the right position!\n";
            std::cout << "Either the refinement patterns are incompatible or there is an issue with the mapping.\n";
            std::cout << "newnodecoord_X(" << newnodecoord_X[0] << "," << newnodecoord_X[1] << "," << newnodecoord_X[2] << ")" << std::endl;
            std::cout << "neighbourcoord_X(" << neighbourcoord_X[0] << "," << neighbourcoord_X[1] << "," << neighbourcoord_X[2] << ")" << std::endl;
			DebugStop();
		}
		if (newnodeindexes[index] == -1)
		{
			//If no one has created the node yet, it should be created
			int64_t newindex = gmesh->NodeVec().AllocateNewElement();
			gmesh->NodeVec()[newindex].Initialize(newnodecoord_X,*gmesh);
			newnodeindexes[index] = newindex;
		}
	}
}